

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O1

int kex_method_diffie_hellman_group_exchange_sha1_key_exchange
              (LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  BIGNUM *pBVar4;
  char *pcVar5;
  size_t p_len;
  uchar *g;
  uchar *p;
  size_t g_len;
  EVP_MD_CTX *exchange_hash_ctx;
  string_buf buf;
  
  if (key_state->state == libssh2_NB_state_idle) {
    pBVar4 = BN_new();
    key_state->p = (BIGNUM *)pBVar4;
    pBVar4 = BN_new();
    key_state->g = (BIGNUM *)pBVar4;
    key_state->request[0] = '\"';
    _libssh2_htonu32(key_state->request + 1,0x800);
    _libssh2_htonu32(key_state->request + 5,0x1000);
    _libssh2_htonu32(key_state->request + 9,0x2000);
    key_state->request_len = 0xd;
    key_state->state = libssh2_NB_state_created;
  }
  if (key_state->state == libssh2_NB_state_created) {
    iVar2 = _libssh2_transport_send
                      (session,key_state->request,key_state->request_len,(uchar *)0x0,0);
    if (iVar2 == -0x25) {
      return -0x25;
    }
    if (iVar2 == 0) {
      key_state->state = libssh2_NB_state_sent;
      goto LAB_00119099;
    }
    pcVar5 = "Unable to send Group Exchange Request";
LAB_00119144:
    iVar2 = _libssh2_error(session,iVar2,pcVar5);
    goto LAB_0011918c;
  }
LAB_00119099:
  if (key_state->state == libssh2_NB_state_sent) {
    iVar2 = _libssh2_packet_require
                      (session,'\x1f',&key_state->data,&key_state->data_len,0,(uchar *)0x0,0,
                       &key_state->req_state);
    if (iVar2 == -0x25) {
      return -0x25;
    }
    if (iVar2 != 0) {
      pcVar5 = "Timeout waiting for GEX_GROUP reply";
      goto LAB_00119144;
    }
    key_state->state = libssh2_NB_state_sent1;
  }
  iVar2 = 0;
  if (key_state->state != libssh2_NB_state_sent1) goto LAB_0011918c;
  if (key_state->data_len < 9) {
    pcVar5 = "Unexpected key length DH-SHA1";
LAB_00119171:
    iVar2 = _libssh2_error(session,-0xe,pcVar5);
    bVar1 = false;
  }
  else {
    buf.data = key_state->data;
    buf.dataptr = buf.data + 1;
    buf.len = key_state->data_len;
    iVar2 = _libssh2_get_bignum_bytes(&buf,&p,&p_len);
    if (iVar2 != 0) {
      pcVar5 = "Unexpected value DH-SHA1 p";
      goto LAB_00119171;
    }
    iVar2 = _libssh2_get_bignum_bytes(&buf,&g,&g_len);
    if (iVar2 != 0) {
      pcVar5 = "Unexpected value DH-SHA1 g";
      goto LAB_00119171;
    }
    BN_bin2bn(p,(int)p_len,(BIGNUM *)key_state->p);
    BN_bin2bn(g,(int)g_len,(BIGNUM *)key_state->g);
    bVar1 = true;
    iVar3 = diffie_hellman_sha_algo
                      (session,key_state->g,key_state->p,(int)p_len,1,&exchange_hash_ctx,' ','!',
                       key_state->data + 1,key_state->data_len - 1,&key_state->exchange_state);
    iVar2 = -0x25;
    if (iVar3 != -0x25) {
      (*session->free)(key_state->data,&session->abstract);
      bVar1 = false;
      iVar2 = iVar3;
    }
  }
  if (bVar1) {
    return -0x25;
  }
LAB_0011918c:
  key_state->state = libssh2_NB_state_idle;
  BN_clear_free((BIGNUM *)key_state->g);
  key_state->g = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)key_state->p);
  key_state->p = (BIGNUM *)0x0;
  return iVar2;
}

Assistant:

static int
kex_method_diffie_hellman_group_exchange_sha1_key_exchange(
                                          LIBSSH2_SESSION * session,
                                          key_exchange_state_low_t * key_state)
{
    int ret = 0;
    int rc;

    if(key_state->state == libssh2_NB_state_idle) {
        key_state->p = _libssh2_bn_init_from_bin();
        key_state->g = _libssh2_bn_init_from_bin();
        /* Ask for a P and G pair */
        key_state->request[0] = SSH_MSG_KEX_DH_GEX_REQUEST;
        _libssh2_htonu32(key_state->request + 1, LIBSSH2_DH_GEX_MINGROUP);
        _libssh2_htonu32(key_state->request + 5, LIBSSH2_DH_GEX_OPTGROUP);
        _libssh2_htonu32(key_state->request + 9, LIBSSH2_DH_GEX_MAXGROUP);
        key_state->request_len = 13;
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Initiating Diffie-Hellman Group-Exchange SHA1"));

        key_state->state = libssh2_NB_state_created;
    }

    if(key_state->state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, key_state->request,
                                     key_state->request_len, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send Group Exchange Request");
            goto dh_gex_clean_exit;
        }

        key_state->state = libssh2_NB_state_sent;
    }

    if(key_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_packet_require(session, SSH_MSG_KEX_DH_GEX_GROUP,
                                     &key_state->data, &key_state->data_len,
                                     0, NULL, 0, &key_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timeout waiting for GEX_GROUP reply");
            goto dh_gex_clean_exit;
        }

        key_state->state = libssh2_NB_state_sent1;
    }

    if(key_state->state == libssh2_NB_state_sent1) {
        size_t p_len, g_len;
        unsigned char *p, *g;
        struct string_buf buf;
        libssh2_sha1_ctx exchange_hash_ctx;

        if(key_state->data_len < 9) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected key length DH-SHA1");
            goto dh_gex_clean_exit;
        }

        buf.data = key_state->data;
        buf.dataptr = buf.data;
        buf.len = key_state->data_len;

        buf.dataptr++; /* increment to big num */

        if(_libssh2_get_bignum_bytes(&buf, &p, &p_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected value DH-SHA1 p");
            goto dh_gex_clean_exit;
        }

        if(_libssh2_get_bignum_bytes(&buf, &g, &g_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected value DH-SHA1 g");
            goto dh_gex_clean_exit;
        }

        _libssh2_bn_from_bin(key_state->p, p_len, p);
        _libssh2_bn_from_bin(key_state->g, g_len, g);

        ret = diffie_hellman_sha_algo(session, key_state->g, key_state->p,
                                      (int)p_len, 1,
                                      (void *)&exchange_hash_ctx,
                                      SSH_MSG_KEX_DH_GEX_INIT,
                                      SSH_MSG_KEX_DH_GEX_REPLY,
                                      key_state->data + 1,
                                      key_state->data_len - 1,
                                      &key_state->exchange_state);
        if(ret == LIBSSH2_ERROR_EAGAIN) {
            return ret;
        }

        LIBSSH2_FREE(session, key_state->data);
    }

dh_gex_clean_exit:
    key_state->state = libssh2_NB_state_idle;
    _libssh2_bn_free(key_state->g);
    key_state->g = NULL;
    _libssh2_bn_free(key_state->p);
    key_state->p = NULL;

    return ret;
}